

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_LoadBlockMap(MapData *map)

{
  size_t __n;
  uint uVar1;
  FileReader *pFVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  int iVar5;
  ulong *buffer;
  undefined1 (*pauVar6) [16];
  long lVar7;
  uint uVar8;
  char *format;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int *piVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_XMM1 [16];
  
  pFVar2 = map->MapLumps[10].Reader;
  if (pFVar2 == (FileReader *)0x0) {
    iVar14 = 0;
  }
  else {
    iVar14 = (int)pFVar2->Length;
  }
  if ((((!ForceNodeBuild) && (!genblockmap.Value)) && (iVar14 != 0 && iVar14 < 0x20000)) &&
     (iVar5 = DArgs::CheckParm(Args,"-blockmap",1), iVar5 == 0)) {
    buffer = (ulong *)operator_new__((long)iVar14);
    MapData::Read(map,10,buffer,-1);
    lVar15 = (long)(iVar14 / 2);
    uVar10 = lVar15 * 4;
    if (iVar14 < -1) {
      uVar10 = 0xffffffffffffffff;
    }
    pauVar6 = (undefined1 (*) [16])operator_new__(uVar10);
    uVar10 = *buffer;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar10;
    auVar17 = pshuflw(in_XMM1,auVar17,0x60);
    auVar18._4_4_ = auVar17._4_4_ >> 0x10;
    auVar18._0_4_ = auVar17._0_4_ >> 0x10;
    auVar3._8_4_ = 0;
    auVar3._0_8_ = uVar10;
    auVar3._12_2_ = (short)(uVar10 >> 0x30);
    auVar4._8_2_ = (short)(uVar10 >> 0x20);
    auVar4._0_8_ = uVar10;
    auVar4._10_4_ = auVar3._10_4_;
    auVar18._8_6_ = auVar4._8_6_;
    auVar18._14_2_ = 0;
    blockmaplump = (int *)pauVar6;
    *pauVar6 = auVar18;
    for (lVar7 = 4; lVar7 < lVar15; lVar7 = lVar7 + 1) {
      uVar8 = (uint)*(ushort *)((long)buffer + lVar7 * 2);
      if (uVar8 == 0xffff) {
        uVar8 = 0xffffffff;
      }
      *(uint *)((long)*pauVar6 + lVar7 * 4) = uVar8;
    }
    operator_delete__(buffer);
    uVar8 = blockmaplump[2];
    uVar1 = blockmaplump[3];
    uVar16 = 0;
    uVar10 = 0;
    if (0 < (int)uVar8) {
      uVar10 = (ulong)uVar8;
    }
    uVar11 = 0;
    if (0 < (int)uVar1) {
      uVar11 = (ulong)uVar1;
    }
    format = "P_VerifyBlockMap: block offset overflow\n";
    for (; uVar16 != uVar11; uVar16 = uVar16 + 1) {
      for (uVar12 = 0; uVar12 != uVar10; uVar12 = uVar12 + 1) {
        if (blockmaplump + lVar15 <= blockmaplump + uVar16 * (long)(int)uVar8 + uVar12 + 4) {
LAB_004d1af0:
          Printf(2,format);
          uVar11 = uVar16;
          goto LAB_004d1afa;
        }
        iVar5 = blockmaplump[uVar16 * (long)(int)uVar8 + uVar12 + 4];
        if (((long)iVar5 < 4) || (iVar14 / 2 <= iVar5)) {
          format = "P_VerifyBlockMap: list offset overflow\n";
          goto LAB_004d1af0;
        }
        piVar9 = blockmaplump + iVar5;
        piVar13 = piVar9;
        do {
          if (blockmaplump + lVar15 <= piVar13) {
            format = "P_VerifyBlockMap: open blocklist\n";
            goto LAB_004d1af0;
          }
          iVar5 = *piVar13;
          piVar13 = piVar13 + 1;
        } while (iVar5 != -1);
        while (iVar5 = *piVar9, iVar5 != -1) {
          if ((iVar5 < 0) || (piVar9 = piVar9 + 1, numlines <= iVar5)) {
            format = "P_VerifyBlockMap: index >= numlines\n";
            goto LAB_004d1af0;
          }
        }
      }
    }
LAB_004d1afa:
    if ((long)(int)uVar1 <= (long)uVar11) goto LAB_004d1b15;
  }
  DPrintf(4,"Generating BLOCKMAP\n");
  P_CreateBlockMap();
LAB_004d1b15:
  piVar13 = blockmaplump;
  bmaporgx = (double)*blockmaplump;
  bmaporgy = (double)blockmaplump[1];
  bmapwidth = blockmaplump[2];
  bmapheight = blockmaplump[3];
  __n = (long)(bmapheight * bmapwidth) * 8;
  uVar10 = 0xffffffffffffffff;
  if (-1 < bmapheight * bmapwidth) {
    uVar10 = __n;
  }
  blocklinks = (FBlockNode **)operator_new__(uVar10);
  memset(blocklinks,0,__n);
  blockmap = piVar13 + 4;
  return;
}

Assistant:

void P_LoadBlockMap (MapData * map)
{
	int count = map->Size(ML_BLOCKMAP);

	if (ForceNodeBuild || genblockmap ||
		count/2 >= 0x10000 || count == 0 ||
		Args->CheckParm("-blockmap")
		)
	{
		DPrintf (DMSG_SPAMMY, "Generating BLOCKMAP\n");
		P_CreateBlockMap ();
	}
	else
	{
		BYTE *data = new BYTE[count];
		map->Read(ML_BLOCKMAP, data);
		const short *wadblockmaplump = (short *)data;
		int i;

		count/=2;
		blockmaplump = new int[count];

		// killough 3/1/98: Expand wad blockmap into larger internal one,
		// by treating all offsets except -1 as unsigned and zero-extending
		// them. This potentially doubles the size of blockmaps allowed,
		// because Doom originally considered the offsets as always signed.

		blockmaplump[0] = LittleShort(wadblockmaplump[0]);
		blockmaplump[1] = LittleShort(wadblockmaplump[1]);
		blockmaplump[2] = (DWORD)(LittleShort(wadblockmaplump[2])) & 0xffff;
		blockmaplump[3] = (DWORD)(LittleShort(wadblockmaplump[3])) & 0xffff;

		for (i = 4; i < count; i++)
		{
			short t = LittleShort(wadblockmaplump[i]);          // killough 3/1/98
			blockmaplump[i] = t == -1 ? (DWORD)0xffffffff : (DWORD) t & 0xffff;
		}
		delete[] data;

		if (!P_VerifyBlockMap(count))
		{
			DPrintf (DMSG_SPAMMY, "Generating BLOCKMAP\n");
			P_CreateBlockMap();
		}

	}

	bmaporgx = blockmaplump[0];
	bmaporgy = blockmaplump[1];
	bmapwidth = blockmaplump[2];
	bmapheight = blockmaplump[3];

	// clear out mobj chains
	count = bmapwidth*bmapheight;
	blocklinks = new FBlockNode *[count];
	memset (blocklinks, 0, count*sizeof(*blocklinks));
	blockmap = blockmaplump+4;
}